

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eclmap.c
# Opt level: O0

int control(state_t *state,int linenum,char *cline)

{
  int iVar1;
  char *cline_local;
  int linenum_local;
  state_t *state_local;
  
  iVar1 = strcmp(cline,"!ins_names");
  if (iVar1 == 0) {
    state->smap = state->emap->ins_names;
    state->ident = 1;
  }
  else {
    iVar1 = strcmp(cline,"!ins_signatures");
    if (iVar1 == 0) {
      state->smap = state->emap->ins_signatures;
      state->ident = 0;
    }
    else {
      iVar1 = strcmp(cline,"!gvar_names");
      if (iVar1 == 0) {
        state->smap = state->emap->gvar_names;
        state->ident = 1;
      }
      else {
        iVar1 = strcmp(cline,"!gvar_types");
        if (iVar1 == 0) {
          state->smap = state->emap->gvar_types;
          state->ident = 0;
        }
        else {
          iVar1 = strcmp(cline,"!timeline_ins_names");
          if (iVar1 == 0) {
            state->smap = state->emap->timeline_ins_names;
            state->ident = 1;
          }
          else {
            iVar1 = strcmp(cline,"!timeline_ins_signatures");
            if (iVar1 != 0) {
              fprintf(_stderr,"%s:%s:%u: unknown control line \'%s\'\n",argv0,state->fn,
                      (ulong)(uint)linenum,cline);
              return 1;
            }
            state->smap = state->emap->timeline_ins_signatures;
            state->ident = 0;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

static int
control(
    state_t *state,
    int linenum,
    const char *cline)
{
    if (!strcmp(cline, "!ins_names")) {
        state->smap = state->emap->ins_names;
        state->ident = 1;
    } else if (!strcmp(cline, "!ins_signatures")) {
        state->smap = state->emap->ins_signatures;
        state->ident = 0;
    } else if (!strcmp(cline, "!gvar_names")) {
        state->smap = state->emap->gvar_names;
        state->ident = 1;
    } else if (!strcmp(cline, "!gvar_types")) {
        state->smap = state->emap->gvar_types;
        state->ident = 0;
    } else if (!strcmp(cline, "!timeline_ins_names")) {
        state->smap = state->emap->timeline_ins_names;
        state->ident = 1;
    } else if (!strcmp(cline, "!timeline_ins_signatures")) {
        state->smap = state->emap->timeline_ins_signatures;
        state->ident = 0;
    } else {
        fprintf(stderr, "%s:%s:%u: unknown control line '%s'\n",argv0,state->fn,linenum,cline);
        return 1;
    }
    return 0;
}